

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_tests.cpp
# Opt level: O1

void __thiscall allocator_tests::lockedpool_tests_mock::test_method(lockedpool_tests_mock *this)

{
  void *pvVar1;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  void *pvVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  LockedPool pool;
  check_type cVar5;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  assertion_result local_120;
  char **local_108;
  undefined1 local_100 [8];
  bool local_f8;
  undefined7 uStack_f7;
  undefined1 *local_f0;
  assertion_result *local_e8;
  assertion_result local_d0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  long *local_98;
  LockedPool local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = (long *)operator_new(0x10);
  *local_98 = (long)&PTR__LockedPageAllocator_013d3fb0;
  local_98[1] = 0x100000003;
  LockedPool::LockedPool
            (&local_90,
             (unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>)&local_98,
             (LockingFailed_Callback)0x0);
  if (local_98 != (long *)0x0) {
    (**(code **)(*local_98 + 8))();
  }
  local_98 = (long *)0x0;
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xab;
  file.m_begin = (iterator)&local_a8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b8,msg);
  LockedPool::stats((Stats *)local_100,&local_90);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_108 = &local_130;
  local_130 = "pool.stats().total == 0";
  local_128 = "";
  local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
  local_120._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_138 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_f0 == (undefined1 *)0x0);
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,(lazy_ostream *)&local_120,1,0,WARN,_cVar5,(size_t)&local_140,0xab);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xac;
  file_00.m_begin = (iterator)&local_150;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_160,
             msg_00);
  LockedPool::stats((Stats *)local_100,&local_90);
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_e8 == (assertion_result *)0x0);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = "pool.stats().locked == 0";
  local_128 = "";
  local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
  local_120._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_108 = &local_130;
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_168 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,(lazy_ostream *)&local_120,1,0,WARN,_cVar5,(size_t)&local_170,0xac);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  pvVar1 = LockedPool::alloc(&local_90,0);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xb0;
  file_01.m_begin = (iterator)&local_180;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_190,
             msg_01);
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pvVar1 == (void *)0x0);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "invalid_toosmall == nullptr";
  local_d0.m_message.px = (element_type *)0xe816b9;
  local_f8 = false;
  local_100 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_198 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_e8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,(lazy_ostream *)local_100,1,0,WARN,_cVar5,(size_t)&local_1a0,0xb0);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xb1;
  file_02.m_begin = (iterator)&local_1b0;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1c0,
             msg_02);
  LockedPool::stats((Stats *)local_100,&local_90);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = "pool.stats().used == 0";
  local_128 = "";
  local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
  local_120._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_108 = &local_130;
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_1c8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_100 == (undefined1  [8])0x0);
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,(lazy_ostream *)&local_120,1,0,WARN,_cVar5,(size_t)&local_1d0,0xb1);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xb2;
  file_03.m_begin = (iterator)&local_1e0;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f0,
             msg_03);
  LockedPool::stats((Stats *)local_100,&local_90);
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(CONCAT71(uStack_f7,local_f8) == 0);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = "pool.stats().free == 0";
  local_128 = "";
  local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
  local_120._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_108 = &local_130;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_1f8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,(lazy_ostream *)&local_120,1,0,WARN,_cVar5,(size_t)&local_200,0xb2);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  pvVar1 = LockedPool::alloc(&local_90,0x40001);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xb4;
  file_04.m_begin = (iterator)&local_210;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_220,
             msg_04);
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pvVar1 == (void *)0x0);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "invalid_toobig == nullptr";
  local_d0.m_message.px = (element_type *)0xe81701;
  local_f8 = false;
  local_100 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_228 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_e8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,(lazy_ostream *)local_100,1,0,WARN,_cVar5,(size_t)&local_230,0xb4);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xb5;
  file_05.m_begin = (iterator)&local_240;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_250,
             msg_05);
  LockedPool::stats((Stats *)local_100,&local_90);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = "pool.stats().used == 0";
  local_128 = "";
  local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
  local_120._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_108 = &local_130;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_258 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_100 == (undefined1  [8])0x0);
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,(lazy_ostream *)&local_120,1,0,WARN,_cVar5,(size_t)&local_260,0xb5);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xb6;
  file_06.m_begin = (iterator)&local_270;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_280,
             msg_06);
  LockedPool::stats((Stats *)local_100,&local_90);
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(CONCAT71(uStack_f7,local_f8) == 0);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = "pool.stats().free == 0";
  local_128 = "";
  local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
  local_120._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_108 = &local_130;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_288 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,(lazy_ostream *)&local_120,1,0,WARN,_cVar5,(size_t)&local_290,0xb6);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  pvVar1 = LockedPool::alloc(&local_90,0x20000);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xb9;
  file_07.m_begin = (iterator)&local_2a0;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2b0,
             msg_07);
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pvVar1 != (void *)0x0);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "a0";
  local_d0.m_message.px = (element_type *)0xea6ad8;
  local_f8 = false;
  local_100 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_2b8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_e8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,(lazy_ostream *)local_100,1,0,WARN,_cVar5,(size_t)&local_2c0,0xb9);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xba;
  file_08.m_begin = (iterator)&local_2d0;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2e0,
             msg_08);
  LockedPool::stats((Stats *)local_100,&local_90);
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_e8 == (assertion_result *)0x40000);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = "pool.stats().locked == LockedPool::ARENA_SIZE";
  local_128 = "";
  local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
  local_120._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_108 = &local_130;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_2e8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,(lazy_ostream *)&local_120,1,0,WARN,_cVar5,(size_t)&local_2f0,0xba);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  __ptr = LockedPool::alloc(&local_90,0x20000);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xbc;
  file_09.m_begin = (iterator)&local_300;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_310,
             msg_09);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "a1";
  local_d0.m_message.px = (element_type *)0xe81732;
  local_f8 = false;
  local_100 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_318 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_e8 = &local_d0;
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(__ptr != (void *)0x0);
  boost::test_tools::tt_detail::report_assertion
            (&local_120,(lazy_ostream *)local_100,1,0,WARN,_cVar5,(size_t)&local_320,0xbc);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  __ptr_00 = LockedPool::alloc(&local_90,0x20000);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xbe;
  file_10.m_begin = (iterator)&local_330;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_340,
             msg_10);
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(__ptr_00 != (void *)0x0);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "a2";
  local_d0.m_message.px = (element_type *)0xe81735;
  local_f8 = false;
  local_100 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_348 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_e8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,(lazy_ostream *)local_100,1,0,WARN,_cVar5,(size_t)&local_350,0xbe);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  __ptr_01 = LockedPool::alloc(&local_90,0x20000);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = &DAT_000000c0;
  file_11.m_begin = (iterator)&local_360;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_370,
             msg_11);
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(__ptr_01 != (void *)0x0);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "a3";
  local_d0.m_message.px = (element_type *)0xf34bd6;
  local_f8 = false;
  local_100 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_378 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_e8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,(lazy_ostream *)local_100,1,0,WARN,_cVar5,(size_t)&local_380,0xc0);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  __ptr_02 = LockedPool::alloc(&local_90,0x20000);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xc2;
  file_12.m_begin = (iterator)&local_390;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3a0,
             msg_12);
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(__ptr_02 != (void *)0x0);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "a4";
  local_d0.m_message.px = (element_type *)0xebf904;
  local_f8 = false;
  local_100 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_3a8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_e8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,(lazy_ostream *)local_100,1,0,WARN,(check_type)__ptr_02,(size_t)&local_3b0,
             0xc2);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  __ptr_03 = LockedPool::alloc(&local_90,0x20000);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xc4;
  file_13.m_begin = (iterator)&local_3c0;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3d0,
             msg_13);
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(__ptr_03 != (void *)0x0);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "a5";
  local_d0.m_message.px = (element_type *)0xf34cb2;
  local_f8 = false;
  local_100 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_d0;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_3d8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,(lazy_ostream *)local_100,1,0,WARN,(check_type)__ptr_02,(size_t)&local_3e0,
             0xc4);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  pvVar2 = LockedPool::alloc(&local_90,0x10);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xc7;
  file_14.m_begin = (iterator)&local_3f0;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_400,
             msg_14);
  local_120.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pvVar2 == (void *)0x0);
  local_120.m_message.px = (element_type *)0x0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0._0_8_ = "!a6";
  local_d0.m_message.px = (element_type *)0xe81739;
  local_f8 = false;
  local_100 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_d0;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_408 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_120,(lazy_ostream *)local_100,1,0,WARN,(check_type)__ptr_02,(size_t)&local_410,
             199);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  LockedPool::free(&local_90,pvVar1);
  LockedPool::free(&local_90,__ptr_00);
  LockedPool::free(&local_90,__ptr_02);
  LockedPool::free(&local_90,__ptr);
  LockedPool::free(&local_90,__ptr_01);
  LockedPool::free(&local_90,__ptr_03);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xcf;
  file_15.m_begin = (iterator)&local_420;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_430,
             msg_15);
  LockedPool::stats((Stats *)local_100,&local_90);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = "pool.stats().total == 3*LockedPool::ARENA_SIZE";
  local_128 = "";
  local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
  local_120._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_108 = &local_130;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_438 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_f0 == (undefined1 *)0xc0000);
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,(lazy_ostream *)&local_120,1,0,WARN,(check_type)__ptr_02,(size_t)&local_440,
             0xcf);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xd0;
  file_16.m_begin = (iterator)&local_450;
  msg_16.m_end = pvVar4;
  msg_16.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_460,
             msg_16);
  LockedPool::stats((Stats *)local_100,&local_90);
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_e8 == (assertion_result *)0x40000);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = "pool.stats().locked == LockedPool::ARENA_SIZE";
  local_128 = "";
  local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
  local_120._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_108 = &local_130;
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_468 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,(lazy_ostream *)&local_120,1,0,WARN,(check_type)__ptr_02,(size_t)&local_470,
             0xd0);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0xd1;
  file_17.m_begin = (iterator)&local_480;
  msg_17.m_end = pvVar4;
  msg_17.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_490,
             msg_17);
  LockedPool::stats((Stats *)local_100,&local_90);
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_100 == (undefined1  [8])0x0);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_130 = "pool.stats().used == 0";
  local_128 = "";
  local_120.m_message.px = (element_type *)((ulong)local_120.m_message.px & 0xffffffffffffff00);
  local_120._0_8_ = &PTR__lazy_ostream_013d3df0;
  local_120.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_108 = &local_130;
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/allocator_tests.cpp"
  ;
  local_498 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,(lazy_ostream *)&local_120,1,0,WARN,(check_type)__ptr_02,(size_t)&local_4a0,
             0xd1);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  LockedPool::~LockedPool(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(lockedpool_tests_mock)
{
    // Test over three virtual arenas, of which one will succeed being locked
    std::unique_ptr<LockedPageAllocator> x = std::make_unique<TestLockedPageAllocator>(3, 1);
    LockedPool pool(std::move(x));
    BOOST_CHECK(pool.stats().total == 0);
    BOOST_CHECK(pool.stats().locked == 0);

    // Ensure unreasonable requests are refused without allocating anything
    void *invalid_toosmall = pool.alloc(0);
    BOOST_CHECK(invalid_toosmall == nullptr);
    BOOST_CHECK(pool.stats().used == 0);
    BOOST_CHECK(pool.stats().free == 0);
    void *invalid_toobig = pool.alloc(LockedPool::ARENA_SIZE+1);
    BOOST_CHECK(invalid_toobig == nullptr);
    BOOST_CHECK(pool.stats().used == 0);
    BOOST_CHECK(pool.stats().free == 0);

    void *a0 = pool.alloc(LockedPool::ARENA_SIZE / 2);
    BOOST_CHECK(a0);
    BOOST_CHECK(pool.stats().locked == LockedPool::ARENA_SIZE);
    void *a1 = pool.alloc(LockedPool::ARENA_SIZE / 2);
    BOOST_CHECK(a1);
    void *a2 = pool.alloc(LockedPool::ARENA_SIZE / 2);
    BOOST_CHECK(a2);
    void *a3 = pool.alloc(LockedPool::ARENA_SIZE / 2);
    BOOST_CHECK(a3);
    void *a4 = pool.alloc(LockedPool::ARENA_SIZE / 2);
    BOOST_CHECK(a4);
    void *a5 = pool.alloc(LockedPool::ARENA_SIZE / 2);
    BOOST_CHECK(a5);
    // We've passed a count of three arenas, so this allocation should fail
    void *a6 = pool.alloc(16);
    BOOST_CHECK(!a6);

    pool.free(a0);
    pool.free(a2);
    pool.free(a4);
    pool.free(a1);
    pool.free(a3);
    pool.free(a5);
    BOOST_CHECK(pool.stats().total == 3*LockedPool::ARENA_SIZE);
    BOOST_CHECK(pool.stats().locked == LockedPool::ARENA_SIZE);
    BOOST_CHECK(pool.stats().used == 0);
}